

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_chmod(void)

{
  uv_buf_t uVar1;
  ssize_t sVar2;
  int iVar3;
  uv_loop_t *loop;
  undefined8 uVar4;
  char *pcVar5;
  uv_fs_t req;
  
  unlink("test_file");
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar3 = uv_fs_open(0,&req,"test_file",0x42,0x180,0);
  sVar2 = req.result;
  uVar1.len = iov.len;
  uVar1.base = iov.base;
  if (iVar3 < 0) {
    pcVar5 = "r >= 0";
    uVar4 = 0x612;
  }
  else if (req.result < 0) {
    pcVar5 = "req.result >= 0";
    uVar4 = 0x613;
    iov = uVar1;
  }
  else {
    uv_fs_req_cleanup(&req);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar3 = uv_fs_write(0,&req,sVar2 & 0xffffffff,&iov,1,0xffffffffffffffff,0);
    if (iVar3 == 0xd) {
      if (req.result == 0xd) {
        uv_fs_req_cleanup(&req);
        iVar3 = uv_fs_chmod(0,&req,"test_file",0x80,0);
        if (iVar3 == 0) {
          if (req.result == 0) {
            uv_fs_req_cleanup(&req);
            check_permission("test_file",0x80);
            iVar3 = uv_fs_chmod(0,&req,"test_file",0x100,0);
            if (iVar3 == 0) {
              if (req.result == 0) {
                uv_fs_req_cleanup(&req);
                check_permission("test_file",0x100);
                iVar3 = uv_fs_fchmod(0,&req,sVar2 & 0xffffffff,0x180,0);
                if (iVar3 == 0) {
                  if (req.result == 0) {
                    uv_fs_req_cleanup(&req);
                    check_permission("test_file",0x180);
                    req.data = &run_test_fs_chmod::mode;
                    iVar3 = uv_fs_chmod(::loop,&req,"test_file",0x80,chmod_cb);
                    if (iVar3 == 0) {
                      uv_run(::loop,0);
                      if (chmod_cb_count == 1) {
                        chmod_cb_count = 0;
                        req.data = &run_test_fs_chmod::mode_1;
                        iVar3 = uv_fs_chmod(::loop,&req,"test_file",0x100,chmod_cb);
                        if (iVar3 == 0) {
                          uv_run(::loop,0);
                          if (chmod_cb_count == 1) {
                            req.data = &run_test_fs_chmod::mode_2;
                            iVar3 = uv_fs_fchmod(::loop,&req,sVar2 & 0xffffffff,0x180,fchmod_cb);
                            if (iVar3 == 0) {
                              uv_run(::loop,0);
                              if (fchmod_cb_count == 1) {
                                uv_fs_close(::loop,&req,sVar2 & 0xffffffff,0);
                                uv_run(::loop,0);
                                unlink("test_file");
                                loop = (uv_loop_t *)uv_default_loop();
                                close_loop(loop);
                                uVar4 = uv_default_loop();
                                iVar3 = uv_loop_close(uVar4);
                                if (iVar3 == 0) {
                                  return 0;
                                }
                                pcVar5 = "0 == uv_loop_close(uv_default_loop())";
                                uVar4 = 0x663;
                              }
                              else {
                                pcVar5 = "fchmod_cb_count == 1";
                                uVar4 = 0x656;
                              }
                            }
                            else {
                              pcVar5 = "r == 0";
                              uVar4 = 0x654;
                            }
                          }
                          else {
                            pcVar5 = "chmod_cb_count == 1";
                            uVar4 = 0x64c;
                          }
                        }
                        else {
                          pcVar5 = "r == 0";
                          uVar4 = 0x64a;
                        }
                      }
                      else {
                        pcVar5 = "chmod_cb_count == 1";
                        uVar4 = 0x640;
                      }
                    }
                    else {
                      pcVar5 = "r == 0";
                      uVar4 = 0x63e;
                    }
                  }
                  else {
                    pcVar5 = "req.result == 0";
                    uVar4 = 0x632;
                  }
                }
                else {
                  pcVar5 = "r == 0";
                  uVar4 = 0x631;
                }
              }
              else {
                pcVar5 = "req.result == 0";
                uVar4 = 0x62a;
              }
            }
            else {
              pcVar5 = "r == 0";
              uVar4 = 0x629;
            }
          }
          else {
            pcVar5 = "req.result == 0";
            uVar4 = 0x621;
          }
        }
        else {
          pcVar5 = "r == 0";
          uVar4 = 0x620;
        }
      }
      else {
        pcVar5 = "req.result == sizeof(test_buf)";
        uVar4 = 0x61a;
      }
    }
    else {
      pcVar5 = "r == sizeof(test_buf)";
      uVar4 = 0x619;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(fs_chmod) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

#ifndef _WIN32
  /* Make the file write-only */
  r = uv_fs_chmod(NULL, &req, "test_file", 0200, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0200);
#endif

  /* Make the file read-only */
  r = uv_fs_chmod(NULL, &req, "test_file", 0400, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0400);

  /* Make the file read+write with sync uv_fs_fchmod */
  r = uv_fs_fchmod(NULL, &req, file, 0600, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0600);

#ifndef _WIN32
  /* async chmod */
  {
    static int mode = 0200;
    req.data = &mode;
  }
  r = uv_fs_chmod(loop, &req, "test_file", 0200, chmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chmod_cb_count == 1);
  chmod_cb_count = 0; /* reset for the next test */
#endif

  /* async chmod */
  {
    static int mode = 0400;
    req.data = &mode;
  }
  r = uv_fs_chmod(loop, &req, "test_file", 0400, chmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chmod_cb_count == 1);

  /* async fchmod */
  {
    static int mode = 0600;
    req.data = &mode;
  }
  r = uv_fs_fchmod(loop, &req, file, 0600, fchmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fchmod_cb_count == 1);

  uv_fs_close(loop, &req, file, NULL);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}